

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
LINSimulationDataGenerator::CreateSerialByte(LINSimulationDataGenerator *this,U8 byte)

{
  int iVar1;
  BitState BVar2;
  
  LINChecksum::add(&this->mChecksum,byte);
  iVar1 = 7;
  do {
    iVar1 = iVar1 + -1;
  } while (iVar1 != -1);
  BVar2 = (int)this + 0x10;
  SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
  SimulationChannelDescriptor::Advance(BVar2);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(BVar2);
  iVar1 = 8;
  do {
    SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
    SimulationChannelDescriptor::Advance(BVar2);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
  SimulationChannelDescriptor::Advance(BVar2);
  return;
}

Assistant:

void LINSimulationDataGenerator::CreateSerialByte( U8 byte )
{
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;

    mChecksum.add( byte );
    SwapEnds( byte );

    // inter-byte space.....
    mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
    mSerialSimulationData.Advance( samples_per_bit * 2 );

    // start bit...
    mSerialSimulationData.Transition();               // low-going edge for start bit
    mSerialSimulationData.Advance( samples_per_bit ); // add start bit time

    U8 mask = 0x1 << 7;
    for( U32 i = 0; i < 8; i++ )
    {
        if( ( byte & mask ) != 0 )
            mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
        else
            mSerialSimulationData.TransitionIfNeeded( BIT_LOW );

        mSerialSimulationData.Advance( samples_per_bit );
        mask = mask >> 1;
    }

    // stop bit...
    mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
    mSerialSimulationData.Advance( samples_per_bit * 2 );
}